

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  wchar_t ac;
  wchar_t vc;
  wchar_t local_70;
  wchar_t local_6c;
  wchar_t *local_68;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs_conflict combiner;
  
  uVar10 = 0x16;
  if (details->alternate_color_first == false) {
    uVar10 = 0;
  }
  local_6c = nlabel;
  local_68 = label;
  local_60 = vals;
  local_58 = auxvals;
  if (((L'+' < info->ncolors) && (L'\f' < info->nlabcolors)) && (L'\x15' < info->nsym)) {
    lVar5.y = 0;
    lVar5.x = (details->value_position).x;
    uVar9 = (ulong)(uint)(details->value_position).y;
    uVar8 = 0;
    uVar7 = 0;
    local_70 = n;
    if (L'\0' < n) {
      uVar7 = (ulong)(uint)n;
    }
    for (; wVar1 = local_6c, uVar7 != uVar8; uVar8 = uVar8 + 1) {
      wVar1 = convert_vanilla_res_level(local_60[uVar8]);
      wVar2 = convert_vanilla_res_level(local_58[uVar8]);
      Term_putch(lVar5.x,(wchar_t)uVar9,
                 info->colors
                 [(long)*(int *)(&DAT_0025c6c0 + (ulong)(uint)wVar2 * 4 + (ulong)(uint)wVar1 * 0x1c)
                  + (long)(int)uVar10],
                 info->symbols
                 [*(int *)(&DAT_0025c6c0 + (ulong)(uint)wVar2 * 4 + (ulong)(uint)wVar1 * 0x1c)]);
      lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar9 << 0x20),
                      (loc_conflict)details->position_step);
      uVar9 = (ulong)lVar5 >> 0x20;
      uVar10 = uVar10 ^ 0x16;
    }
    if ((L'\0' < local_6c) || (details->show_combined == true)) {
      iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&combiner)
      ;
      if (iVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                      ,0x259,
                      "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*combiner.vec_func)(local_70,local_60,local_58,&vc,&ac);
      if (L'\0' < wVar1) {
        if (details->known_rune == true) {
          wVar2 = convert_vanilla_res_level(vc);
          wVar4 = convert_vanilla_res_level(ac);
          lVar6 = (long)*(int *)(&DAT_0025c790 + (ulong)(uint)wVar4 * 4 + (ulong)(uint)wVar2 * 0x1c)
          ;
        }
        else {
          lVar6 = 0;
        }
        wVar2 = (details->label_position).x;
        wVar4 = (details->label_position).y;
        if (details->vertical_label == true) {
          for (uVar7 = 0; (uint)wVar1 != uVar7; uVar7 = uVar7 + 1) {
            Term_putch(wVar2,wVar4 + (int)uVar7,info->label_colors[lVar6],local_68[uVar7]);
          }
        }
        else {
          safe_queue_chars(wVar2,wVar4,wVar1,info->label_colors[lVar6],local_68);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,vc,ac);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 44 && info->nlabcolors >= 13 && info->nsym >= 22",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                ,0x242,
                "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	/*
	 * Fastest varying is no timed effect, timed resistance,
	 * timed vulnerability, timed immunity, unknown timed effect,
	 * no value for timed effect, timed resistance + timed vulnerability
	 */
	const int combined_effect_tbl[7][7] = {
		/* No permanent effect */
		{  2,  6,  9, 11,  2,  2, 18 },
		/* Permanent resistance */
		{  3,  7, 10, 12,  3,  3, 19 },
		/* Permanent vulnerability */
		{  4,  8,  4, 13,  4,  4, 20 },
		/* Permanent immunity */
		{  5,  5,  5,  5,  5,  5,  5 },
		/* Unknown permanent effect */
		{  0,  0,  0,  0,  0,  0,  0 },
		/* No value for permanent effect */
		{  1,  1,  1,  1,  1,  1,  1 },
		/* Permanent resistance + permanent vulnerability */
		{ 14, 15, 16, 17, 14, 14, 21 }
	};
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 22 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 44 && info->nlabcolors >= 13 &&
		info->nsym >= 22);

	for (i = 0; i < n; ++i) {
		int untimed_effect = convert_vanilla_res_level(vals[i]);
		int timed_effect = convert_vanilla_res_level(auxvals[i]);
		int palette_index;

		assert(untimed_effect >= 0 && untimed_effect < 7 &&
			timed_effect >= 0 && timed_effect < 7);
		palette_index =
			combined_effect_tbl[untimed_effect][timed_effect];
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 22;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		const int combined_label_tbl[7][7] = {
			/* No permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance */
			{ 2, 6, 9, 11, 2, 2, 2 },
			/* Permanent vulnerability */
			{ 3, 7, 3, 12, 3, 3, 3 },
			/* Permanent immunity */
			{ 4, 4, 4,  4, 4, 4, 4 },
			/* Unknown permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* No value for permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance + permanent vulnerability */
			{ 1, 5, 8, 10, 1, 1, 1 }
		};
		int palette_index;

		if (details->known_rune) {
			int untimed_effect = convert_vanilla_res_level(vc);
			int timed_effect = convert_vanilla_res_level(ac);

			assert(untimed_effect >= 0 && untimed_effect < 7 &&
				timed_effect >= 0 && timed_effect < 7);
			palette_index =
				combined_label_tbl[untimed_effect][timed_effect];
		} else {
			palette_index = 0;
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}